

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::RunMemoryCheck(SystemInformationImplementation *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  long lVar7;
  uint uVar8;
  undefined4 uStack_628;
  undefined2 uStack_624;
  undefined2 uStack_622;
  long lStack_620;
  ulong uStack_618;
  ulong uStack_610;
  ulong uStack_608;
  long lStack_600;
  ulong auStack_5f8 [4];
  ulong uStack_5d8;
  ulong uStack_5d0;
  utsname uStack_5be;
  char acStack_438 [1032];
  
  uVar8 = 0;
  uStack_608 = 0;
  uStack_610 = 0;
  uStack_618 = 0;
  lStack_620 = 0;
  iVar2 = uname(&uStack_5be);
  if (iVar2 == 0) {
    sVar6 = strlen(uStack_5be.release);
    bVar1 = false;
    if (2 < sVar6) {
      uVar8 = 0;
      if ((int)uStack_5be.release[0] - 0x30U < 10) {
        uVar8 = (int)uStack_5be.release[0] - 0x30U;
      }
      bVar1 = '5' < uStack_5be.release[2] && (int)uStack_5be.release[2] - 0x30U < 10;
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar8) || ((bool)(uVar8 == 2 & bVar1))) {
        uStack_624 = 0;
        uStack_628 = 0;
        pcVar5 = fgets(acStack_438,0x400,__stream);
        if (pcVar5 != (char *)0x0) {
          lVar7 = 0;
          iVar2 = 0;
          do {
            do {
              if ((*(char *)((long)&uStack_628 + lVar7) == '\0') &&
                 (iVar3 = __isoc99_sscanf(acStack_438,
                                          (long)&DAT_0013ede4 + (long)(int)(&DAT_0013ede4)[lVar7],
                                          auStack_5f8 + lVar7), iVar3 == 1)) {
                *(undefined1 *)((long)&uStack_628 + lVar7) = 1;
                iVar2 = iVar2 + 1;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            pcVar5 = fgets(acStack_438,0x400,__stream);
            lVar7 = 0;
          } while (pcVar5 != (char *)0x0);
          if (iVar2 == 6) {
            this->TotalPhysicalMemory = auStack_5f8[0] >> 10;
            this->AvailablePhysicalMemory = auStack_5f8[2] + auStack_5f8[1] + auStack_5f8[3] >> 10;
            this->TotalVirtualMemory = uStack_5d8 >> 10;
            this->AvailableVirtualMemory = uStack_5d0 >> 10;
            goto LAB_00133e22;
          }
        }
      }
      else {
        pcVar5 = fgets(acStack_438,0x400,__stream);
        if (pcVar5 == acStack_438) {
          iVar2 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&uStack_610,auStack_5f8,
                                  &lStack_620,auStack_5f8,&lStack_600,&uStack_628);
          if (iVar2 == 6) {
            iVar2 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&uStack_608,auStack_5f8,
                                    &uStack_618);
            iVar2 = iVar2 + 6;
          }
          if (iVar2 == 9) {
            this->TotalVirtualMemory = uStack_608 >> 0x14;
            this->TotalPhysicalMemory = uStack_610 >> 0x14;
            this->AvailableVirtualMemory = uStack_618 >> 0x14;
            this->AvailablePhysicalMemory =
                 (ulong)(lStack_600 + lStack_620 +
                        CONCAT26(uStack_622,CONCAT24(uStack_624,uStack_628))) >> 0x14;
LAB_00133e22:
            fclose(__stream);
            return;
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      fclose(__stream);
      return;
    }
    pcVar5 = "Problem opening /proc/meminfo";
    sVar6 = 0x1d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem calling uname(): ",0x19);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
      goto LAB_00133d14;
    }
    sVar6 = strlen(pcVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
LAB_00133d14:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

void SystemInformationImplementation::RunMemoryCheck()
{
#if defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisMemory();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXMemory();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDMemory();
#elif defined(__CYGWIN__)
  this->QueryCygwinMemory();
#elif defined(_WIN32)
  this->QueryWindowsMemory();
#elif defined(__hpux)
  this->QueryHPUXMemory();
#elif defined(__linux)
  this->QueryLinuxMemory();
#elif defined(_AIX)
  this->QueryAIXMemory();
#else
  this->QueryMemory();
#endif
}